

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

Float __thiscall pbrt::Triangle::SolidAngle(Triangle *this,Point3f *p)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  ulong uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Float FVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Vector3f a;
  Vector3f b;
  Vector3f c;
  
  lVar13 = (long)this->triIndex;
  lVar9 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar12 = *(long *)(lVar9 + 8);
  lVar9 = *(long *)(lVar9 + 0x10);
  lVar14 = (long)*(int *)(lVar12 + lVar13 * 0xc);
  lVar15 = (long)*(int *)(lVar12 + 4 + lVar13 * 0xc);
  fVar18 = *(float *)(lVar9 + 8 + lVar15 * 0xc);
  lVar12 = (long)*(int *)(lVar12 + 8 + lVar13 * 0xc);
  fVar1 = *(float *)(lVar9 + 8 + lVar12 * 0xc);
  fVar10 = *(float *)(lVar9 + 8 + lVar14 * 0xc) - (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(lVar9 + lVar14 * 0xc);
  uVar2 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar6 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar26._4_4_ = uVar6;
  auVar26._0_4_ = uVar2;
  auVar26._8_8_ = 0;
  auVar26 = vsubps_avx(auVar20,auVar26);
  auVar21._0_4_ = auVar26._0_4_ * auVar26._0_4_;
  auVar21._4_4_ = auVar26._4_4_ * auVar26._4_4_;
  auVar21._8_4_ = auVar26._8_4_ * auVar26._8_4_;
  auVar21._12_4_ = auVar26._12_4_ * auVar26._12_4_;
  auVar20 = vhaddps_avx(auVar21,auVar21);
  fVar16 = auVar20._0_4_ + fVar10 * fVar10;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(lVar9 + lVar15 * 0xc);
  uVar5 = *(ulong *)(lVar9 + lVar12 * 0xc);
  if (fVar16 < 0.0) {
    fVar16 = sqrtf(fVar16);
  }
  else {
    auVar20 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
    fVar16 = auVar20._0_4_;
  }
  uVar3 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar7 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar22._4_4_ = uVar7;
  auVar22._0_4_ = uVar3;
  auVar22._8_8_ = 0;
  auVar21 = vsubps_avx(auVar29,auVar22);
  auVar23._0_4_ = auVar21._0_4_ * auVar21._0_4_;
  auVar23._4_4_ = auVar21._4_4_ * auVar21._4_4_;
  auVar23._8_4_ = auVar21._8_4_ * auVar21._8_4_;
  auVar23._12_4_ = auVar21._12_4_ * auVar21._12_4_;
  auVar20 = vhaddps_avx(auVar23,auVar23);
  auVar30._4_4_ = fVar16;
  auVar30._0_4_ = fVar16;
  auVar30._8_4_ = fVar16;
  auVar30._12_4_ = fVar16;
  fVar18 = fVar18 - (p->super_Tuple3<pbrt::Point3,_float>).z;
  fVar17 = auVar20._0_4_ + fVar18 * fVar18;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    auVar20 = vsqrtss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
    fVar17 = auVar20._0_4_;
  }
  auVar20 = vdivps_avx(auVar26,auVar30);
  auVar27._4_4_ = fVar17;
  auVar27._0_4_ = fVar17;
  auVar27._8_4_ = fVar17;
  auVar27._12_4_ = fVar17;
  auVar26 = vdivps_avx(auVar21,auVar27);
  b.super_Tuple3<pbrt::Vector3,_float>.z = fVar18 / fVar17;
  uVar4 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar8 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar24._4_4_ = uVar8;
  auVar24._0_4_ = uVar4;
  auVar24._8_8_ = 0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar5;
  auVar29 = vsubps_avx(auVar11,auVar24);
  auVar25._0_4_ = auVar29._0_4_ * auVar29._0_4_;
  auVar25._4_4_ = auVar29._4_4_ * auVar29._4_4_;
  auVar25._8_4_ = auVar29._8_4_ * auVar29._8_4_;
  auVar25._12_4_ = auVar29._12_4_ * auVar29._12_4_;
  auVar21 = vhaddps_avx(auVar25,auVar25);
  fVar1 = fVar1 - (p->super_Tuple3<pbrt::Point3,_float>).z;
  fVar18 = auVar21._0_4_ + fVar1 * fVar1;
  if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
  }
  else {
    auVar21 = vsqrtss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
    fVar18 = auVar21._0_4_;
  }
  auVar28._4_4_ = fVar18;
  auVar28._0_4_ = fVar18;
  auVar28._8_4_ = fVar18;
  auVar28._12_4_ = fVar18;
  auVar21 = vdivps_avx(auVar29,auVar28);
  c.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 / fVar18;
  a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar20._0_8_;
  a.super_Tuple3<pbrt::Vector3,_float>.z = fVar10 / fVar16;
  b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar26._0_8_;
  c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar21._0_8_;
  FVar19 = SphericalTriangleArea(a,b,c);
  return FVar19;
}

Assistant:

PBRT_CPU_GPU
    Float SolidAngle(const Point3f &p) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return SphericalTriangleArea(Normalize(p0 - p), Normalize(p1 - p),
                                     Normalize(p2 - p));
    }